

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Drive.cpp
# Opt level: O2

void __thiscall Storage::Disk::Drive::invalidate_track(Drive *this)

{
  __shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2> local_28;
  
  this->random_interval_ = 0.0;
  local_28._M_ptr = (element_type *)0x0;
  local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>::operator=
            (&(this->track_).super___shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2>,
             (__shared_ptr<Storage::Disk::Track,_(__gnu_cxx::_Lock_policy)2> *)&local_28);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  if ((this->patched_track_).super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Storage::Disk::Track,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<Storage::Disk::PCMTrack,void>
              ((__shared_ptr<Storage::Disk::Track,(__gnu_cxx::_Lock_policy)2> *)&local_28,
               &(this->patched_track_).
                super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>);
    set_track(this,(shared_ptr<Storage::Disk::Track> *)&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
    local_28._M_ptr = (element_type *)0x0;
    local_28._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::__shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&(this->patched_track_).
                super___shared_ptr<Storage::Disk::PCMTrack,_(__gnu_cxx::_Lock_policy)2>,&local_28);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_28._M_refcount);
  }
  return;
}

Assistant:

void Drive::invalidate_track() {
	random_interval_ = 0.0f;
	track_ = nullptr;
	if(patched_track_) {
		set_track(patched_track_);
		patched_track_ = nullptr;
	}
}